

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

void run_repl(void)

{
  ssize_t sVar1;
  char *local_2140;
  LineArray lines;
  Vm vm;
  
  vm_init(&vm,true);
  lines.count = 0;
  lines.cap = 0;
  lines.lines = (char **)0x0;
  while( true ) {
    printf(">>> ");
    sVar1 = read_line(&local_2140);
    if (sVar1 < 0) break;
    interpret_interactive(&vm,local_2140);
    write_line(&lines,local_2140);
  }
  fwrite("Bye.\n",5,1,_stderr);
  exit(0);
}

Assistant:

void run_repl() {
    Vm vm;
    vm_init(&vm, true);

    LineArray lines;
    init_line_array(&lines);

    while (true) {
        repl(&vm, &lines);
    }
}